

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

uint32_t mp_decode_binl(char **data)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  
  pcVar4 = *data;
  cVar1 = *pcVar4;
  *data = pcVar4 + 1;
  if (cVar1 == -0x3a) {
    uVar3 = *(uint *)(pcVar4 + 1);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    pcVar4 = pcVar4 + 5;
  }
  else {
    if (cVar1 == -0x3b) {
      uVar2 = *(ushort *)(pcVar4 + 1);
      *data = pcVar4 + 3;
      return (uint32_t)(ushort)(uVar2 << 8 | uVar2 >> 8);
    }
    if (cVar1 != -0x3c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xa71,"uint32_t mp_decode_binl(const char **)");
    }
    uVar3 = (uint)(byte)pcVar4[1];
    pcVar4 = pcVar4 + 2;
  }
  *data = pcVar4;
  return uVar3;
}

Assistant:

MP_IMPL uint32_t
mp_decode_binl(const char **data)
{
	uint8_t c = mp_load_u8(data);

	switch (c) {
	case 0xc4:
		return mp_load_u8(data);
	case 0xc5:
		return mp_load_u16(data);
	case 0xc6:
		return mp_load_u32(data);
	default:
		mp_unreachable();
	}
}